

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
deqp::gles3::Functional::getFBODiscardAttachments
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          deUint32 discardBufferBits)

{
  value_type_conflict4 local_38 [7];
  value_type_conflict4 local_1c;
  undefined1 local_15;
  uint local_14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_10;
  deUint32 discardBufferBits_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *attachments;
  
  local_15 = 0;
  local_14 = discardBufferBits;
  pvStack_10 = __return_storage_ptr__;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  if ((local_14 & 0x4000) != 0) {
    local_1c = 0x8ce0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,&local_1c);
  }
  if ((local_14 & 0x500) == 0x500) {
    local_38[2] = 0x821a;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,local_38 + 2);
  }
  else if ((local_14 & 0x100) == 0) {
    if ((local_14 & 0x400) != 0) {
      local_38[0] = 0x8d20;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,local_38);
    }
  }
  else {
    local_38[1] = 0x8d00;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,local_38 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<deUint32> getFBODiscardAttachments (deUint32 discardBufferBits)
{
	vector<deUint32> attachments;

	if (discardBufferBits & GL_COLOR_BUFFER_BIT)
		attachments.push_back(GL_COLOR_ATTACHMENT0);

	// \note DEPTH_STENCIL_ATTACHMENT is allowed when discarding FBO, but not with default FB
	if ((discardBufferBits & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)) == (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT))
		attachments.push_back(GL_DEPTH_STENCIL_ATTACHMENT);
	else if (discardBufferBits & GL_DEPTH_BUFFER_BIT)
		attachments.push_back(GL_DEPTH_ATTACHMENT);
	else if (discardBufferBits & GL_STENCIL_BUFFER_BIT)
		attachments.push_back(GL_STENCIL_ATTACHMENT);

	return attachments;
}